

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

Cxx20SupportLevel __thiscall
cmGeneratorTarget::HaveCxxModuleSupport(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  bool bVar2;
  Cxx20SupportLevel CVar3;
  cmState *this_01;
  cmStandardLevelResolver standardResolver;
  string local_70;
  cmStandardLevelResolver local_50;
  string local_48;
  
  this_01 = cmMakefile::GetState(this->Makefile);
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CXX","");
  bVar2 = cmState::GetLanguageEnabled(this_01,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  CVar3 = MissingCxx;
  if (bVar2) {
    local_50.Makefile = this->Makefile;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CXX","");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"cxx_std_20","");
    bVar2 = cmStandardLevelResolver::HaveStandardAvailable
                      (&local_50,this,&local_70,config,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    CVar3 = NoCxx20;
    if (bVar2) {
      this_00 = this->Makefile;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"CMAKE_EXPERIMENTAL_CXX_MODULE_DYNDEP","");
      bVar2 = cmMakefile::IsOn(this_00,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      CVar3 = (uint)bVar2 * 2 + MissingExperimentalFlag;
    }
  }
  return CVar3;
}

Assistant:

cmGeneratorTarget::Cxx20SupportLevel cmGeneratorTarget::HaveCxxModuleSupport(
  std::string const& config) const
{
  auto const* state = this->Makefile->GetState();
  if (!state->GetLanguageEnabled("CXX")) {
    return Cxx20SupportLevel::MissingCxx;
  }
  cmStandardLevelResolver standardResolver(this->Makefile);
  if (!standardResolver.HaveStandardAvailable(this, "CXX", config,
                                              "cxx_std_20")) {
    return Cxx20SupportLevel::NoCxx20;
  }
  if (!this->Makefile->IsOn("CMAKE_EXPERIMENTAL_CXX_MODULE_DYNDEP")) {
    return Cxx20SupportLevel::MissingExperimentalFlag;
  }
  return Cxx20SupportLevel::Supported;
}